

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeArrays.hpp
# Opt level: O2

vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
njoy::ENDFtk::section::Type<14>::makeArrays
          (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
           *__return_storage_ptr__,vector<double,_std::allocator<double>_> *energies,
          vector<double,_std::allocator<double>_> *levels)

{
  undefined8 *puVar1;
  ulong uVar2;
  ulong uVar3;
  char *in_stack_ffffffffffffffb8;
  array<double,_2UL> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::reserve
            (__return_storage_ptr__,uVar3 & 0xffffffff);
  if ((uVar3 & 0xffffffff) ==
      (long)(levels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(levels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    for (uVar2 = 0; (uVar3 & 0xffffffff) != uVar2; uVar2 = uVar2 + 1) {
      local_40._M_elems[0] =
           (energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar2];
      local_40._M_elems[1] =
           (levels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar2];
      std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
      emplace_back<std::array<double,2ul>>
                ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)
                 __return_storage_ptr__,&local_40);
    }
    return __return_storage_ptr__;
  }
  tools::Log::error<char_const*>(in_stack_ffffffffffffffb8);
  tools::Log::info<char_const*,unsigned_int>("Number of photon energy values: {}",(uint)uVar3);
  tools::Log::info<char_const*,unsigned_long>
            ("Number of energy level values: {}",
             (long)(levels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(levels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< std::array< double, 2 > >
makeArrays( std::vector< double >&& energies,
            std::vector< double >&& levels ) {

  std::vector< std::array< double, 2 > > sequence;
  unsigned int size = energies.size();
  sequence.reserve( size );

  if ( size != levels.size() ) {

    Log::error( "Encountered inconsistent number of photon energy values and "
                "level energy values" );
    Log::info( "Number of photon energy values: {}", size );
    Log::info( "Number of energy level values: {}", levels.size() );
    throw std::exception();
  }

  for ( unsigned int i = 0; i < size; ++i ) {

    sequence.push_back( {{ energies[i], levels[i] }} );
  }

  return sequence;
}